

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
vector_s(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
         *this,vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
               *other)

{
  pointer pvVar1;
  reference pvVar2;
  size_type sVar3;
  pointer insert_ptr;
  size_type i;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  *other_local;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  *this_local;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  insert_ptr = (pointer)size(other);
  while (insert_ptr != (pointer)0x0) {
    insert_ptr = (pointer)((long)&insert_ptr[-1].field_2._M_allocated_capacity + 0xf);
    pvVar1 = this->data_ptr_;
    pvVar2 = operator[](other,(size_type)insert_ptr);
    std::__cxx11::string::string((string *)(pvVar1 + (long)insert_ptr),(string *)pvVar2);
  }
  sVar3 = size(other);
  this->size_ = sVar3;
  return;
}

Assistant:

vector_s( vector_s&& other ) noexcept
    {
        for (auto i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(std::move(other[i]));
        }
        size_ = other.size();
    }